

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qproperty.cpp
# Opt level: O2

QUntypedPropertyBinding __thiscall
QtPrivate::PropertyAdaptorSlotObjectHelpers::getBinding
          (PropertyAdaptorSlotObjectHelpers *this,QUntypedPropertyData *d)

{
  QPropertyBindingPrivate *priv;
  
  priv = QPropertyBindingData::binding((QPropertyBindingData *)(d + 0x10));
  QUntypedPropertyBinding::QUntypedPropertyBinding((QUntypedPropertyBinding *)this,priv);
  return (QUntypedPropertyBinding)(QPropertyBindingPrivatePtr)this;
}

Assistant:

QUntypedPropertyBinding getBinding(const QUntypedPropertyData *d)
{
    auto adaptor = static_cast<const QtPrivate::QPropertyAdaptorSlotObject *>(d);
    return QUntypedPropertyBinding(adaptor->bindingData().binding());
}